

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O0

void * ihevc_buf_mgr_get_next_free(buf_mgr_t *ps_buf_mgr,WORD32 *pi4_buf_id)

{
  int *in_RSI;
  int *in_RDI;
  void *pv_ret_ptr;
  WORD32 id;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (*in_RDI <= local_14) {
      return (void *)0x0;
    }
    if (in_RDI[(long)local_14 + 2] == 2) break;
    if ((in_RDI[(long)local_14 + 2] == 0) && (*(long *)(in_RDI + (long)local_14 * 2 + 0x42) != 0)) {
      *in_RSI = local_14;
      in_RDI[(long)local_14 + 2] = 1;
      return *(void **)(in_RDI + (long)local_14 * 2 + 0x42);
    }
    local_14 = local_14 + 1;
  }
  __assert_fail("(ps_buf_mgr->au4_status[id] != 2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_buf_mgr.c"
                ,0xaa,"void *ihevc_buf_mgr_get_next_free(buf_mgr_t *, WORD32 *)");
}

Assistant:

void* ihevc_buf_mgr_get_next_free(
                buf_mgr_t *ps_buf_mgr,
                WORD32 *pi4_buf_id)
{
    WORD32 id;
    void *pv_ret_ptr;

    pv_ret_ptr = NULL;
    for(id = 0; id < (WORD32)ps_buf_mgr->u4_max_buf_cnt; id++)
    {
        ASSERT(ps_buf_mgr->au4_status[id] != 2);

        /* Check if the buffer is non-null and status is zero */
        if((ps_buf_mgr->au4_status[id] == 0) && (ps_buf_mgr->apv_ptr[id]))
        {
            *pi4_buf_id = id;
            /* DEC is set to 1 */
            ps_buf_mgr->au4_status[id] = 1;
            pv_ret_ptr = ps_buf_mgr->apv_ptr[id];
            break;
        }
    }

    return pv_ret_ptr;
}